

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

ostream * operator<<(ostream *out,pair<double,_double> *pair)

{
  ostream *poVar1;
  
  std::operator<<(out,"[");
  poVar1 = std::ostream::_M_insert<double>(pair->first);
  std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<double>(pair->second);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::pair<U, V> &pair)
{
    out << "[" << pair.first << ", " << pair.second << "]" << std::endl;
    return out;
}